

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

pair<unsigned_long,_rangeless::fn::impl::X> * __thiscall
rangeless::fn::impl::maybe<std::pair<unsigned_long,_rangeless::fn::impl::X>_>::operator*
          (maybe<std::pair<unsigned_long,_rangeless::fn::impl::X>_> *this)

{
  maybe<std::pair<unsigned_long,_rangeless::fn::impl::X>_> *this_local;
  
  if (((this->m_empty ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_empty",
                  "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                  ,199,
                  "T &rangeless::fn::impl::maybe<std::pair<unsigned long, rangeless::fn::impl::X>>::operator*() [T = std::pair<unsigned long, rangeless::fn::impl::X>]"
                 );
  }
  return (pair<unsigned_long,_rangeless::fn::impl::X> *)this;
}

Assistant:

T& operator*() noexcept
        {
            assert(!m_empty);

#if __cplusplus >= 201703L
            return *std::launder(&m_value);
#else
            return m_value;
#endif
        }